

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void parse_body(LexState *ls,ExpDesc *e,int needself,BCLine line)

{
  uint8_t *puVar1;
  byte bVar2;
  ushort uVar3;
  FuncState *fs_00;
  BCInsLine *pBVar4;
  BCInsLine *pBVar5;
  FuncState *fs_01;
  FuncState *pFVar6;
  VarInfo *pVVar7;
  byte bVar8;
  int iVar9;
  BCPos BVar10;
  GCstr *pGVar11;
  GCobj *gc;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  BCReg BVar15;
  uint uVar16;
  BCReg BVar17;
  FuncScope bl;
  FuncState fs;
  FuncScope local_320;
  FuncState local_310;
  
  fs_00 = ls->fs;
  pBVar4 = fs_00->bcbase;
  pBVar5 = ls->bcstack;
  fs_init(ls,&local_310);
  local_320.nactvar = (uint8_t)local_310.nactvar;
  local_320.flags = '\0';
  local_320.vstart = (local_310.ls)->vtop;
  local_320.prev = local_310.bl;
  fs_01 = ls->fs;
  local_310.bl = &local_320;
  local_310.linedefined = line;
  lex_check(ls,0x28);
  if (needself != 0) {
    pGVar11 = lj_parse_keepstr(ls,"self",4);
    var_new(ls,0,pGVar11);
  }
  BVar17 = (BCReg)(needself != 0);
  iVar9 = ls->tok;
  if (iVar9 != 0x29) {
    while( true ) {
      if ((iVar9 != 0x10a) && (iVar9 != 0x11f)) {
        if (iVar9 != 0x118) {
          err_syntax(ls,LJ_ERR_XPARAM);
        }
        lj_lex_next(ls);
        puVar1 = &fs_01->flags;
        *puVar1 = *puVar1 | 2;
        goto LAB_00128375;
      }
      pGVar11 = lex_str(ls);
      var_new(ls,BVar17,pGVar11);
      if (ls->tok != 0x2c) break;
      lj_lex_next(ls);
      iVar9 = ls->tok;
      BVar17 = BVar17 + 1;
    }
    BVar17 = BVar17 + 1;
  }
LAB_00128375:
  pFVar6 = ls->fs;
  uVar16 = pFVar6->nactvar;
  if (BVar17 != 0) {
    pVVar7 = ls->vstack;
    BVar10 = pFVar6->pc;
    uVar13 = uVar16;
    BVar15 = BVar17;
    do {
      uVar3 = pFVar6->varmap[uVar13];
      uVar16 = uVar13 + 1;
      pVVar7[uVar3].startpc = BVar10;
      pVVar7[uVar3].slot = (uint8_t)uVar13;
      pVVar7[uVar3].info = '\0';
      BVar15 = BVar15 - 1;
      uVar13 = uVar16;
    } while (BVar15 != 0);
  }
  pFVar6->nactvar = uVar16;
  bcreg_reserve(fs_01,BVar17);
  lex_check(ls,0x29);
  local_310.numparams = (uint8_t)BVar17;
  local_310.bcbase = fs_00->bcbase + fs_00->pc;
  local_310.bclim = fs_00->bclim - fs_00->pc;
  bcemit_INS(&local_310,0x59);
  parse_chunk(ls);
  if (ls->tok != 0x106) {
    lex_match(ls,0x106,0x109,line);
  }
  uVar14 = (long)pBVar4 - (long)pBVar5;
  ls->lastline = ls->linenumber;
  gc = (GCobj *)fs_finish(ls,ls->linenumber);
  fs_00->bcbase = (BCInsLine *)(uVar14 + (long)ls->bcstack);
  fs_00->bclim = ls->sizebcstack - (int)(uVar14 >> 3);
  BVar17 = const_gc(fs_00,gc,0xfffffff8);
  BVar10 = bcemit_INS(fs_00,BVar17 * 0x10000 + 0x33);
  e->k = VRELOCABLE;
  (e->u).s.info = BVar10;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bVar2 = fs_00->flags;
  bVar8 = local_310.flags & 4 | bVar2;
  bVar12 = bVar2 * '\x02' & 0x40 | bVar8 | 1;
  if ((bVar2 & 1) != 0) {
    bVar12 = bVar8;
  }
  fs_00->flags = bVar12;
  lj_lex_next(ls);
  return;
}

Assistant:

static void parse_body(LexState *ls, ExpDesc *e, int needself, BCLine line)
{
  FuncState fs, *pfs = ls->fs;
  FuncScope bl;
  GCproto *pt;
  ptrdiff_t oldbase = pfs->bcbase - ls->bcstack;
  fs_init(ls, &fs);
  fscope_begin(&fs, &bl, 0);
  fs.linedefined = line;
  fs.numparams = (uint8_t)parse_params(ls, needself);
  fs.bcbase = pfs->bcbase + pfs->pc;
  fs.bclim = pfs->bclim - pfs->pc;
  bcemit_AD(&fs, BC_FUNCF, 0, 0);  /* Placeholder. */
  parse_chunk(ls);
  if (ls->tok != TK_end) lex_match(ls, TK_end, TK_function, line);
  pt = fs_finish(ls, (ls->lastline = ls->linenumber));
  pfs->bcbase = ls->bcstack + oldbase;  /* May have been reallocated. */
  pfs->bclim = (BCPos)(ls->sizebcstack - oldbase);
  /* Store new prototype in the constant array of the parent. */
  expr_init(e, VRELOCABLE,
	    bcemit_AD(pfs, BC_FNEW, 0, const_gc(pfs, obj2gco(pt), LJ_TPROTO)));
#if LJ_HASFFI
  pfs->flags |= (fs.flags & PROTO_FFI);
#endif
  if (!(pfs->flags & PROTO_CHILD)) {
    if (pfs->flags & PROTO_HAS_RETURN)
      pfs->flags |= PROTO_FIXUP_RETURN;
    pfs->flags |= PROTO_CHILD;
  }
  lj_lex_next(ls);
}